

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

WrinkledTexture *
pbrt::WrinkledTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  allocator<char> local_ce;
  allocator<char> local_cd;
  Float local_cc;
  string local_c8;
  string local_a8;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined8 uStack_30;
  undefined8 *puVar3;
  WrinkledTexture *pWVar4;
  
  local_a8._M_dataplus._M_p = *(pointer *)(renderFromTexture->mInv).m[0];
  local_a8._M_string_length = *(size_type *)((renderFromTexture->mInv).m[0] + 2);
  local_a8.field_2._M_allocated_capacity = *(undefined8 *)(renderFromTexture->mInv).m[1];
  local_a8.field_2._8_8_ = *(undefined8 *)((renderFromTexture->mInv).m[1] + 2);
  uStack_88 = *(undefined8 *)(renderFromTexture->mInv).m[2];
  uStack_80 = *(undefined8 *)((renderFromTexture->mInv).m[2] + 2);
  uStack_78 = *(undefined8 *)(renderFromTexture->mInv).m[3];
  uStack_70 = *(undefined8 *)((renderFromTexture->mInv).m[3] + 2);
  local_68 = *(undefined8 *)(renderFromTexture->m).m[0];
  uStack_60 = *(undefined8 *)((renderFromTexture->m).m[0] + 2);
  uStack_58 = *(undefined8 *)(renderFromTexture->m).m[1];
  uStack_50 = *(undefined8 *)((renderFromTexture->m).m[1] + 2);
  uStack_48 = *(undefined8 *)(renderFromTexture->m).m[2];
  uStack_40 = *(undefined8 *)((renderFromTexture->m).m[2] + 2);
  uStack_38 = *(undefined8 *)(renderFromTexture->m).m[3];
  uStack_30 = *(undefined8 *)((renderFromTexture->m).m[3] + 2);
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x80,4);
  puVar3 = (undefined8 *)CONCAT44(extraout_var,iVar1);
  *puVar3 = local_a8._M_dataplus._M_p;
  puVar3[1] = local_a8._M_string_length;
  puVar3[2] = local_a8.field_2._M_allocated_capacity;
  puVar3[3] = local_a8.field_2._8_8_;
  puVar3[4] = uStack_88;
  puVar3[5] = uStack_80;
  puVar3[6] = uStack_78;
  puVar3[7] = uStack_70;
  puVar3[8] = local_68;
  puVar3[9] = uStack_60;
  puVar3[10] = uStack_58;
  puVar3[0xb] = uStack_50;
  puVar3[0xc] = uStack_48;
  puVar3[0xd] = uStack_40;
  puVar3[0xe] = uStack_38;
  puVar3[0xf] = uStack_30;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"octaves",&local_cd);
  iVar1 = TextureParameterDictionary::GetOneInt(parameters,&local_a8,8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"roughness",&local_ce);
  local_cc = TextureParameterDictionary::GetOneFloat(parameters,&local_c8,0.5);
  iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x10,8);
  pWVar4 = (WrinkledTexture *)CONCAT44(extraout_var_00,iVar2);
  (pWVar4->mapping).super_TaggedPointer<pbrt::TransformMapping3D>.bits =
       (ulong)puVar3 | 0x1000000000000;
  pWVar4->octaves = iVar1;
  pWVar4->omega = local_cc;
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  return pWVar4;
}

Assistant:

WrinkledTexture *WrinkledTexture::Create(const Transform &renderFromTexture,
                                         const TextureParameterDictionary &parameters,
                                         const FileLoc *loc, Allocator alloc) {
    // Initialize 3D texture mapping _map_ from _tp_
    TextureMapping3DHandle map =
        TextureMapping3DHandle::Create(parameters, renderFromTexture, loc, alloc);
    return alloc.new_object<WrinkledTexture>(map, parameters.GetOneInt("octaves", 8),
                                             parameters.GetOneFloat("roughness", .5f));
}